

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_ipfs.c
# Opt level: O0

CURLcode ipfs_url_rewrite(CURLU *uh,char *protocol,char **url,OperationConfig *config)

{
  CURLcode CVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  char *local_a8;
  CURLU *gatewayurl;
  char *cloneurl;
  char *pathbuffer;
  char *cid;
  char *inputpath;
  char *gwport;
  char *gwscheme;
  char *gwquery;
  char *gwpath;
  char *gwhost;
  char *gateway;
  CURLUcode getResult;
  CURLcode result;
  OperationConfig *config_local;
  char **url_local;
  char *protocol_local;
  CURLU *uh_local;
  
  gateway._4_4_ = CURLE_URL_MALFORMAT;
  gwhost = (char *)0x0;
  gwpath = (char *)0x0;
  gwquery = (char *)0x0;
  gwscheme = (char *)0x0;
  gwport = (char *)0x0;
  inputpath = (char *)0x0;
  cid = (char *)0x0;
  pathbuffer = (char *)0x0;
  cloneurl = (char *)0x0;
  _getResult = config;
  config_local = (OperationConfig *)url;
  url_local = (char **)protocol;
  protocol_local = (char *)uh;
  lVar3 = curl_url();
  if (lVar3 == 0) {
    gateway._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    gateway._0_4_ = curl_url_get(protocol_local,5,&pathbuffer,0x40);
    if (((int)gateway == 0) && (pathbuffer != (char *)0x0)) {
      if (_getResult->ipfs_gateway == (char *)0x0) {
        gwhost = ipfs_gateway();
        if (gwhost == (char *)0x0) {
          gateway._4_4_ = CURLE_FILE_COULDNT_READ_FILE;
          goto LAB_0011795a;
        }
        iVar2 = curl_url_set(lVar3,0,gwhost);
        if (iVar2 != 0) {
          gateway._4_4_ = CURLE_URL_MALFORMAT;
          goto LAB_0011795a;
        }
      }
      else {
        CVar1 = ensure_trailing_slash(&_getResult->ipfs_gateway);
        if (CVar1 != CURLE_OK) {
          gateway._4_4_ = CURLE_OUT_OF_MEMORY;
          goto LAB_0011795a;
        }
        iVar2 = curl_url_set(lVar3,0,_getResult->ipfs_gateway,0x200);
        if (iVar2 != 0) {
          gateway._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
          goto LAB_0011795a;
        }
        gwhost = strdup(_getResult->ipfs_gateway);
        if (gwhost == (char *)0x0) {
          gateway._4_4_ = CURLE_URL_MALFORMAT;
          goto LAB_0011795a;
        }
      }
      iVar2 = curl_url_get(lVar3,8,&gwscheme,0);
      if (iVar2 == 0x10) {
        iVar2 = curl_url_get(lVar3,5,&gwpath,0x40);
        if ((iVar2 == 0) && (iVar2 = curl_url_get(lVar3,1,&gwport,0x40), iVar2 == 0)) {
          curl_url_get(lVar3,6,&inputpath,0x40);
          curl_url_get(lVar3,7,&gwquery,0x40);
          curl_url_get(protocol_local,7,&cid,0x40);
          iVar2 = curl_url_set(protocol_local,1,gwport,0x80);
          if ((iVar2 == 0) &&
             ((iVar2 = curl_url_set(protocol_local,5,gwpath,0x80), iVar2 == 0 &&
              (iVar2 = curl_url_set(protocol_local,6,inputpath,0x80), iVar2 == 0)))) {
            if ((cid != (char *)0x0) && ((*cid == '/' && (cid[1] == '\0')))) {
              *cid = '\0';
            }
            ensure_trailing_slash(&gwquery);
            if (cid == (char *)0x0) {
              local_a8 = "";
            }
            else {
              local_a8 = cid;
            }
            cloneurl = (char *)curl_maprintf("%s%s/%s%s",gwquery,url_local,pathbuffer,local_a8);
            if ((cloneurl != (char *)0x0) &&
               (iVar2 = curl_url_set(protocol_local,7,cloneurl,0x80), iVar2 == 0)) {
              free(*(void **)config_local);
              *(undefined8 *)config_local = 0;
              iVar2 = curl_url_get(protocol_local,0,&gatewayurl,0x80);
              if (iVar2 == 0) {
                pcVar4 = strdup((char *)gatewayurl);
                *(char **)config_local = pcVar4;
                curl_free(gatewayurl);
                if (*(long *)config_local != 0) {
                  gateway._4_4_ = CURLE_OK;
                }
              }
            }
          }
        }
      }
      else {
        gateway._4_4_ = CURLE_URL_MALFORMAT;
      }
    }
  }
LAB_0011795a:
  free(gwhost);
  curl_free(gwpath);
  curl_free(gwquery);
  curl_free(gwscheme);
  curl_free(cid);
  curl_free(gwport);
  curl_free(inputpath);
  curl_free(pathbuffer);
  curl_free(cloneurl);
  curl_url_cleanup(lVar3);
  if (gateway._4_4_ == CURLE_URL_MALFORMAT) {
    helpf(tool_stderr,"malformed target URL");
  }
  else if (gateway._4_4_ == CURLE_FILE_COULDNT_READ_FILE) {
    helpf(tool_stderr,"IPFS automatic gateway detection failed");
  }
  else if (gateway._4_4_ == CURLE_BAD_FUNCTION_ARGUMENT) {
    helpf(tool_stderr,"--ipfs-gateway was given a malformed URL");
  }
  return gateway._4_4_;
}

Assistant:

CURLcode ipfs_url_rewrite(CURLU *uh, const char *protocol, char **url,
                          struct OperationConfig *config)
{
  CURLcode result = CURLE_URL_MALFORMAT;
  CURLUcode getResult;
  char *gateway = NULL;
  char *gwhost = NULL;
  char *gwpath = NULL;
  char *gwquery = NULL;
  char *gwscheme = NULL;
  char *gwport = NULL;
  char *inputpath = NULL;
  char *cid = NULL;
  char *pathbuffer = NULL;
  char *cloneurl;
  CURLU *gatewayurl = curl_url();

  if(!gatewayurl) {
    result = CURLE_FAILED_INIT;
    goto clean;
  }

  getResult = curl_url_get(uh, CURLUPART_HOST, &cid, CURLU_URLDECODE);
  if(getResult || !cid)
    goto clean;

  /* We might have a --ipfs-gateway argument. Check it first and use it. Error
   * if we do have something but if it is an invalid url.
   */
  if(config->ipfs_gateway) {
    /* ensure the gateway ends in a trailing / */
    if(ensure_trailing_slash(&config->ipfs_gateway) != CURLE_OK) {
      result = CURLE_OUT_OF_MEMORY;
      goto clean;
    }

    if(!curl_url_set(gatewayurl, CURLUPART_URL, config->ipfs_gateway,
                    CURLU_GUESS_SCHEME)) {
      gateway = strdup(config->ipfs_gateway);
      if(!gateway) {
        result = CURLE_URL_MALFORMAT;
        goto clean;
      }

    }
    else {
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto clean;
    }
  }
  else {
    /* this is ensured to end in a trailing / within ipfs_gateway() */
    gateway = ipfs_gateway();
    if(!gateway) {
      result = CURLE_FILE_COULDNT_READ_FILE;
      goto clean;
    }

    if(curl_url_set(gatewayurl, CURLUPART_URL, gateway, 0)) {
      result = CURLE_URL_MALFORMAT;
      goto clean;
    }
  }

  /* check for unsupported gateway parts */
  if(curl_url_get(gatewayurl, CURLUPART_QUERY, &gwquery, 0)
                  != CURLUE_NO_QUERY) {
    result = CURLE_URL_MALFORMAT;
    goto clean;
  }

  /* get gateway parts */
  if(curl_url_get(gatewayurl, CURLUPART_HOST,
                  &gwhost, CURLU_URLDECODE)) {
    goto clean;
  }

  if(curl_url_get(gatewayurl, CURLUPART_SCHEME,
                  &gwscheme, CURLU_URLDECODE)) {
    goto clean;
  }

  curl_url_get(gatewayurl, CURLUPART_PORT, &gwport, CURLU_URLDECODE);
  curl_url_get(gatewayurl, CURLUPART_PATH, &gwpath, CURLU_URLDECODE);

  /* get the path from user input */
  curl_url_get(uh, CURLUPART_PATH, &inputpath, CURLU_URLDECODE);
  /* inputpath might be NULL or a valid pointer now */

  /* set gateway parts in input url */
  if(curl_url_set(uh, CURLUPART_SCHEME, gwscheme, CURLU_URLENCODE) ||
     curl_url_set(uh, CURLUPART_HOST, gwhost, CURLU_URLENCODE) ||
     curl_url_set(uh, CURLUPART_PORT, gwport, CURLU_URLENCODE))
    goto clean;

  /* if the input path is just a slash, clear it */
  if(inputpath && (inputpath[0] == '/') && !inputpath[1])
    *inputpath = '\0';

  /* ensure the gateway path ends with a trailing slash */
  ensure_trailing_slash(&gwpath);

  pathbuffer = aprintf("%s%s/%s%s", gwpath, protocol, cid,
                       inputpath ? inputpath : "");
  if(!pathbuffer) {
    goto clean;
  }

  if(curl_url_set(uh, CURLUPART_PATH, pathbuffer, CURLU_URLENCODE)) {
    goto clean;
  }

  /* Free whatever it has now, rewriting is next */
  Curl_safefree(*url);

  if(curl_url_get(uh, CURLUPART_URL, &cloneurl, CURLU_URLENCODE)) {
    goto clean;
  }
  /* we need to strdup the URL so that we can call free() on it later */
  *url = strdup(cloneurl);
  curl_free(cloneurl);
  if(!*url)
    goto clean;

  result = CURLE_OK;

clean:
  free(gateway);
  curl_free(gwhost);
  curl_free(gwpath);
  curl_free(gwquery);
  curl_free(inputpath);
  curl_free(gwscheme);
  curl_free(gwport);
  curl_free(cid);
  curl_free(pathbuffer);
  curl_url_cleanup(gatewayurl);
  {
    switch(result) {
    case CURLE_URL_MALFORMAT:
      helpf(tool_stderr, "malformed target URL");
      break;
    case CURLE_FILE_COULDNT_READ_FILE:
      helpf(tool_stderr, "IPFS automatic gateway detection failed");
      break;
    case CURLE_BAD_FUNCTION_ARGUMENT:
      helpf(tool_stderr, "--ipfs-gateway was given a malformed URL");
      break;
    default:
      break;
    }
  }
  return result;
}